

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zbuild_huffman(stbi__zhuffman *z,stbi_uc *sizelist,int num)

{
  byte bVar1;
  int iVar2;
  uint bits;
  int local_d8;
  int j;
  stbi__uint16 fastv;
  int c;
  int s;
  int sizes [17];
  int aiStack_78 [2];
  int next_code [16];
  int local_30;
  int local_2c;
  int code;
  int k;
  int i;
  int num_local;
  stbi_uc *sizelist_local;
  stbi__zhuffman *z_local;
  
  local_2c = 0;
  memset(&c,0,0x44);
  memset(z,0,0x400);
  for (code = 0; code < num; code = code + 1) {
    (&c)[sizelist[code]] = (&c)[sizelist[code]] + 1;
  }
  c = 0;
  for (code = 1; code < 0x10; code = code + 1) {
    if (1 << ((byte)code & 0x1f) < (&c)[code]) {
      iVar2 = stbi__err("bad sizes");
      return iVar2;
    }
  }
  local_30 = 0;
  code = 1;
  while( true ) {
    if (0xf < code) {
      z->maxcode[0x10] = 0x10000;
      for (code = 0; code < num; code = code + 1) {
        bVar1 = sizelist[code];
        bits = (uint)bVar1;
        if (bits != 0) {
          iVar2 = (aiStack_78[(int)bits] - (uint)z->firstcode[(int)bits]) +
                  (uint)z->firstsymbol[(int)bits];
          z->size[iVar2] = bVar1;
          z->value[iVar2] = (ushort)code;
          if (bits < 10) {
            for (local_d8 = stbi__bit_reverse(aiStack_78[(int)bits],bits); local_d8 < 0x200;
                local_d8 = (1 << (bVar1 & 0x1f)) + local_d8) {
              z->fast[local_d8] = (ushort)bVar1 << 9 | (ushort)code;
            }
          }
          aiStack_78[(int)bits] = aiStack_78[(int)bits] + 1;
        }
      }
      return 1;
    }
    aiStack_78[code] = local_30;
    z->firstcode[code] = (stbi__uint16)local_30;
    z->firstsymbol[code] = (stbi__uint16)local_2c;
    local_30 = local_30 + (&c)[code];
    if (((&c)[code] != 0) && (1 << ((byte)code & 0x1f) <= local_30 + -1)) break;
    z->maxcode[code] = local_30 << (0x10 - (byte)code & 0x1f);
    local_30 = local_30 * 2;
    local_2c = (&c)[code] + local_2c;
    code = code + 1;
  }
  iVar2 = stbi__err("bad codelengths");
  return iVar2;
}

Assistant:

static int stbi__zbuild_huffman(stbi__zhuffman *z, const stbi_uc *sizelist, int num)
{
    int i, k = 0;
    int code, next_code[16], sizes[17];

    // DEFLATE spec for generating codes
    memset(sizes, 0, sizeof(sizes));
    memset(z->fast, 0, sizeof(z->fast));
    for (i = 0; i < num; ++i)
        ++sizes[sizelist[i]];
    sizes[0] = 0;
    for (i = 1; i < 16; ++i)
        if (sizes[i] > (1 << i))
            return stbi__err("bad sizes", "Corrupt PNG");
    code = 0;
    for (i = 1; i < 16; ++i)
    {
        next_code[i] = code;
        z->firstcode[i] = (stbi__uint16) code;
        z->firstsymbol[i] = (stbi__uint16) k;
        code = (code + sizes[i]);
        if (sizes[i])
            if (code - 1 >= (1 << i)) return stbi__err("bad codelengths", "Corrupt PNG");
        z->maxcode[i] = code << (16 - i); // preshift for inner loop
        code <<= 1;
        k += sizes[i];
    }
    z->maxcode[16] = 0x10000; // sentinel
    for (i = 0; i < num; ++i)
    {
        int s = sizelist[i];
        if (s)
        {
            int c = next_code[s] - z->firstcode[s] + z->firstsymbol[s];
            stbi__uint16 fastv = (stbi__uint16) ((s << 9) | i);
            z->size[c] = (stbi_uc) s;
            z->value[c] = (stbi__uint16) i;
            if (s <= STBI__ZFAST_BITS)
            {
                int j = stbi__bit_reverse(next_code[s], s);
                while (j < (1 << STBI__ZFAST_BITS))
                {
                    z->fast[j] = fastv;
                    j += (1 << s);
                }
            }
            ++next_code[s];
        }
    }
    return 1;
}